

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O1

ans_smsb_encode<20U> *
ans_smsb_encode<20U>::create(ans_smsb_encode<20U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  long *plVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  void *__s;
  size_t sVar10;
  uint64_t uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint64_t *puVar15;
  long lVar16;
  long lVar17;
  uint largest_sym;
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  undefined1 local_68 [16];
  pointer local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  __s = operator_new(0x2800);
  local_68._8_8_ = __s;
  local_68._0_8_ = __s;
  largest_sym = 0;
  local_58 = (pointer)((long)__s + 0x2800);
  memset(__s,0,0x2800);
  local_68._8_8_ = (pointer)((long)__s + 0x2800);
  if (n != 0) {
    sVar10 = 0;
    largest_sym = 0;
    do {
      uVar12 = in_u32[sVar10];
      if (0x100 < uVar12) {
        if (uVar12 < 0x10001) {
          uVar12 = (uVar12 >> 8) + 0x100;
        }
        else if (uVar12 < 0x1000001) {
          uVar12 = uVar12 >> 0x10 | 0x200;
        }
        else {
          uVar12 = uVar12 >> 0x18 | 0x300;
        }
      }
      plVar1 = (long *)((long)__s + (ulong)uVar12 * 8);
      *plVar1 = *plVar1 + 1;
      if (largest_sym < uVar12) {
        largest_sym = uVar12;
      }
      sVar10 = sVar10 + 1;
    } while (n != sVar10);
  }
  adjust_freqs(&local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
               largest_sym,true,0x14);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    uVar11 = 0;
  }
  else {
    auVar20 = vpbroadcastq_avx512f();
    auVar20 = vpsrlq_avx512f(auVar20,2);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    uVar14 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar23 = vmovdqa64_avx512f(auVar25);
      auVar25 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar25,auVar21);
      auVar25 = vporq_avx512f(auVar25,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar25,auVar20,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar24,auVar20,2);
      bVar9 = (byte)uVar7;
      uVar18 = CONCAT11(bVar9,bVar8);
      auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar14));
      auVar24._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar25._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar25._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar25._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar25._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar25._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar25._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar25._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar25._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar25._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar25._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar25._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar25._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar25._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar25._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar25._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar25._60_4_;
      auVar25 = vpaddd_avx512f(auVar24,auVar23);
      uVar14 = uVar14 + 0x10;
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar14);
    auVar20 = vmovdqa32_avx512f(auVar25);
    auVar21._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar4 * auVar20._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar4 * auVar20._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar4 * auVar20._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar4 * auVar20._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar4 * auVar20._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar4 * auVar20._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar4 * auVar20._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar21._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar4 * auVar20._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar4 * auVar20._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar4 * auVar20._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar4 * auVar20._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar4 * auVar20._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar4 * auVar20._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar21._60_4_ =
         (uint)(bVar9 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar21,1);
    auVar20 = vpaddd_avx512f(auVar21,ZEXT3264(auVar19));
    auVar5 = vpaddd_avx(auVar20._0_16_,auVar20._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar11 = (uint64_t)auVar5._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar11;
  std::vector<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>::resize
            (&__return_storage_ptr__->table,(ulong)(largest_sym + 1));
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 2;
    puVar15 = &((__return_storage_ptr__->table).
                super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
                super__Vector_impl_data._M_start)->sym_upper_bound;
    lVar16 = 0;
    lVar17 = 0;
    do {
      ((enc_entry_smsb *)(puVar15 + -1))->freq = puVar2[lVar16];
      *(uint32_t *)((long)puVar15 + -4) = (uint32_t)lVar17;
      lVar17 = lVar17 + (ulong)puVar2[lVar16];
      *puVar15 = (ulong)puVar2[lVar16] << 0x24;
      lVar16 = lVar16 + 1;
      puVar15 = puVar15 + 2;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar16);
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_smsb_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_smsb_encode model;
        std::vector<uint64_t> freqs(smsb_constants::MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_smsb_mapping(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }